

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_mv_merge.c
# Opt level: O0

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,UWORD32 *pu4_top_pu_idx,UWORD32 *pu4_left_pu_idx,
                    WORD32 left_nbr_4x4_strd,pu_t *ps_pu,WORD32 part_mode,WORD32 part_idx,
                    WORD32 part_wd,WORD32 part_ht,WORD32 part_pos_x,WORD32 part_pos_y,
                    WORD32 single_mcl_flag,WORD32 lb_avail,WORD32 l_avail,WORD32 tr_avail,
                    WORD32 t_avail,WORD32 tl_avail)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  WORD32 WVar12;
  undefined8 *puVar13;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  bool bVar14;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  WORD32 zero_idx;
  WORD32 num_ref_idx;
  pic_buf_t *ps_pic_buf_l1;
  pic_buf_t *ps_pic_buf_l0;
  int in_stack_00000040;
  mv_t s_l1_mv;
  mv_t s_l0_mv;
  WORD8 i1_l1_ref_idx;
  WORD8 i1_l0_ref_idx;
  WORD32 total_bi_pred_cand;
  WORD32 bi_pred_idx;
  WORD32 l1_cand;
  WORD32 l0_cand;
  WORD32 priority_list1 [12];
  WORD32 priority_list0 [12];
  WORD32 slice_type;
  WORD32 avail_col_l1;
  WORD32 avail_col_l0;
  WORD32 y_col;
  WORD32 x_col;
  WORD32 avail_col_flag [2];
  mv_t as_mv_col [2];
  WORD32 avail_flag_3;
  WORD32 avail_flag_2;
  WORD32 avail_flag_1;
  WORD32 avail_flag;
  WORD32 pos_y_merge_shift;
  WORD32 pos_x_merge_shift;
  WORD32 candidate_cnt;
  WORD32 max_num_merge_cand;
  pu_t *ps_nbr_pu [5];
  WORD32 nbr_pu_idx;
  WORD32 merge_shift;
  WORD32 nbr_avail [5];
  WORD32 nbr_y;
  WORD32 nbr_x;
  WORD32 sum_avail_a0_a1_b0_b1;
  ref_list_t *ps_ref_list [2];
  pps_t *ps_pps;
  pu_t as_pu_merge_list [5];
  slice_header_t *ps_slice_hdr;
  bool local_1ed;
  int local_1ec;
  byte local_1e4;
  byte local_1e3;
  byte local_1e2;
  byte local_1e1;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  pu_t *in_stack_fffffffffffffe28;
  short local_1c2;
  short sStack_1c0;
  short local_1be;
  short sStack_1bc;
  int local_1b4;
  int local_1a8 [12];
  int local_178 [14];
  WORD32 in_stack_fffffffffffffec0;
  WORD32 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint in_stack_fffffffffffffed8;
  uint uVar15;
  uint in_stack_fffffffffffffedc;
  uint uVar16;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint local_114;
  uint y_col_00;
  uint local_10c;
  uint local_100;
  uint local_c4;
  uint local_bc;
  uint local_ac;
  long local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_38;
  undefined8 *local_28;
  int local_1c;
  long local_18;
  long local_10;
  long *local_8;
  
  local_ac = 0;
  lVar7 = in_RDI[2];
  local_38 = lVar7;
  local_a0 = lVar7 + 0x4f8;
  if (*(char *)(lVar7 + 0x50) == '\x01') {
    local_a0 = lVar7 + 0x378;
  }
  local_100 = 0;
  bVar1 = *(byte *)(*in_RDI + 0x33);
  iVar8 = zero_idx + in_stack_00000018 + -1;
  puVar13 = (undefined8 *)
            (in_RDI[5] +
            (long)*(int *)(in_RDX + (long)((iVar8 - zero_idx >> 2) * in_ECX) * 4) * 0x10);
  local_1e1 = 0;
  if (in_stack_00000040 != 0) {
    local_1e1 = (*(uint *)((long)puVar13 + 0xc) >> 0x10 & 1) != 0 ^ 0xff;
  }
  local_c4 = (uint)(local_1e1 & 1);
  iVar9 = in_stack_00000020 >> (bVar1 & 0x1f);
  iVar10 = zero_idx >> (bVar1 & 0x1f);
  uVar11 = (*(uint *)((long)in_R8 + 0xc) >> 0x14 & 7) + 1;
  if (local_c4 != 0) {
    if ((iVar9 == in_stack_00000020 + -1 >> (bVar1 & 0x1f)) && (iVar10 == iVar8 >> (bVar1 & 0x1f)))
    {
      local_c4 = 0;
    }
    else if ((((int)ps_pic_buf_l1 == 0) && (in_stack_00000008 == 1)) &&
            (((in_R9D == 2 || (in_R9D == 6)) || (in_R9D == 7)))) {
      local_c4 = 0;
    }
    local_ac = local_c4;
    if (local_c4 != 0) {
      local_88 = *puVar13;
      uStack_80 = puVar13[1];
      local_100 = 1;
      if (uVar11 == 1) {
        *in_R8 = *puVar13;
        *(undefined4 *)(in_R8 + 1) = (undefined4)uStack_80;
        *(uint *)((long)in_R8 + 0xc) =
             *(uint *)((long)in_R8 + 0xc) & 0xfff9ffff |
             ((uint)((ulong)uStack_80 >> 0x31) & 3) << 0x11;
        return;
      }
    }
  }
  iVar8 = in_stack_00000020 + in_stack_00000010 + -1;
  puVar13 = (undefined8 *)
            (in_RDI[5] + (long)*(int *)(in_RSI + (long)(iVar8 - in_stack_00000020 >> 2) * 4) * 0x10)
  ;
  local_1e2 = 0;
  if (total_bi_pred_cand != 0) {
    local_1e2 = (*(uint *)((long)puVar13 + 0xc) >> 0x10 & 1) != 0 ^ 0xff;
  }
  local_bc = (uint)(local_1e2 & 1);
  uVar15 = local_100;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_bc != 0) {
    if ((iVar9 == iVar8 >> (bVar1 & 0x1f)) && (iVar10 == zero_idx + -1 >> (bVar1 & 0x1f))) {
      local_bc = 0;
      local_10c = 0;
    }
    else if ((((int)ps_pic_buf_l1 == 0) && (in_stack_00000008 == 1)) &&
            (((in_R9D == 1 || (in_R9D == 4)) || (in_R9D == 5)))) {
      local_bc = 0;
      local_10c = 0;
    }
    else {
      local_10c = local_bc;
      if (local_c4 != 0) {
        WVar12 = ihevcd_compare_pu_t(in_stack_fffffffffffffe28,
                                     (pu_t *)CONCAT44(in_stack_fffffffffffffe24,
                                                      in_stack_fffffffffffffe20));
        local_10c = (uint)((WVar12 != 0 ^ 0xffU) & 1);
      }
    }
    local_ac = local_10c + local_ac;
    if (local_10c != 0) {
      (&local_88)[(long)(int)local_100 * 2] = *puVar13;
      (&uStack_80)[(long)(int)local_100 * 2] = puVar13[1];
      uVar15 = local_100 + 1;
      if (local_100 + 1 == uVar11) {
        *local_28 = (&local_88)[(long)(int)local_100 * 2];
        *(undefined4 *)(local_28 + 1) = *(undefined4 *)(&uStack_80 + (long)(int)local_100 * 2);
        *(uint *)((long)local_28 + 0xc) =
             *(uint *)((long)local_28 + 0xc) & 0xfff9ffff |
             (*(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) >> 0x11 & 3) << 0x11;
        return;
      }
    }
  }
  local_100 = uVar15;
  puVar13 = (undefined8 *)
            (local_8[5] +
            (long)*(int *)(local_10 +
                          (long)((in_stack_00000020 + in_stack_00000010) - in_stack_00000020 >> 2) *
                          4) * 0x10);
  local_1e3 = 0;
  if (stack0x00000048 != 0) {
    local_1e3 = (*(uint *)((long)puVar13 + 0xc) >> 0x10 & 1) != 0 ^ 0xff;
  }
  y_col_00 = (uint)(local_1e3 & 1);
  uVar15 = local_100;
  if (y_col_00 != 0) {
    if ((iVar9 == in_stack_00000020 + in_stack_00000010 >> (bVar1 & 0x1f)) &&
       (iVar10 == zero_idx + -1 >> (bVar1 & 0x1f))) {
      y_col_00 = 0;
    }
    else if (local_bc != 0) {
      WVar12 = ihevcd_compare_pu_t(in_stack_fffffffffffffe28,
                                   (pu_t *)CONCAT44(in_stack_fffffffffffffe24,
                                                    in_stack_fffffffffffffe20));
      y_col_00 = (uint)((WVar12 != 0 ^ 0xffU) & 1);
    }
    local_ac = y_col_00 + local_ac;
    if (y_col_00 != 0) {
      (&local_88)[(long)(int)local_100 * 2] = *puVar13;
      (&uStack_80)[(long)(int)local_100 * 2] = puVar13[1];
      uVar15 = local_100 + 1;
      if (local_100 + 1 == uVar11) {
        *local_28 = (&local_88)[(long)(int)local_100 * 2];
        *(undefined4 *)(local_28 + 1) = *(undefined4 *)(&uStack_80 + (long)(int)local_100 * 2);
        *(uint *)((long)local_28 + 0xc) =
             *(uint *)((long)local_28 + 0xc) & 0xfff9ffff |
             (*(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) >> 0x11 & 3) << 0x11;
        return;
      }
    }
  }
  local_100 = uVar15;
  puVar13 = (undefined8 *)
            (local_8[5] +
            (long)*(int *)(local_18 +
                          (long)(((zero_idx + in_stack_00000018) - zero_idx >> 2) * local_1c) * 4) *
            0x10);
  local_1e4 = 0;
  if ((int)ps_pic_buf_l0 != 0) {
    local_1e4 = (*(uint *)((long)puVar13 + 0xc) >> 0x10 & 1) != 0 ^ 0xff;
  }
  local_114 = (uint)(local_1e4 & 1);
  uVar15 = local_100;
  if (local_114 != 0) {
    if ((iVar9 == in_stack_00000020 + -1 >> (bVar1 & 0x1f)) &&
       (iVar10 == zero_idx + in_stack_00000018 >> (bVar1 & 0x1f))) {
      local_114 = 0;
    }
    else if (local_c4 != 0) {
      WVar12 = ihevcd_compare_pu_t(in_stack_fffffffffffffe28,
                                   (pu_t *)CONCAT44(in_stack_fffffffffffffe24,
                                                    in_stack_fffffffffffffe20));
      local_114 = (uint)((WVar12 != 0 ^ 0xffU) & 1);
    }
    local_ac = local_114 + local_ac;
    if (local_114 != 0) {
      (&local_88)[(long)(int)local_100 * 2] = *puVar13;
      (&uStack_80)[(long)(int)local_100 * 2] = puVar13[1];
      uVar15 = local_100 + 1;
      if (local_100 + 1 == uVar11) {
        *local_28 = (&local_88)[(long)(int)local_100 * 2];
        *(undefined4 *)(local_28 + 1) = *(undefined4 *)(&uStack_80 + (long)(int)local_100 * 2);
        *(uint *)((long)local_28 + 0xc) =
             *(uint *)((long)local_28 + 0xc) & 0xfff9ffff |
             (*(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) >> 0x11 & 3) << 0x11;
        return;
      }
    }
  }
  local_100 = uVar15;
  puVar13 = (undefined8 *)
            (local_8[5] +
            (long)*(int *)(local_10 + (long)((in_stack_00000020 + -1) - in_stack_00000020 >> 2) * 4)
            * 0x10);
  bVar14 = false;
  if (l1_cand != 0) {
    bVar14 = (*(uint *)((long)puVar13 + 0xc) >> 0x10 & 1) == 0;
  }
  uVar15 = local_100;
  if (bVar14) {
    if ((iVar9 == in_stack_00000020 + -1 >> (bVar1 & 0x1f)) &&
       (iVar10 == zero_idx + -1 >> (bVar1 & 0x1f))) {
      bVar14 = false;
    }
    else if (local_ac == 4) {
      bVar14 = false;
    }
    else {
      if (local_c4 != 0) {
        WVar12 = ihevcd_compare_pu_t(in_stack_fffffffffffffe28,
                                     (pu_t *)CONCAT44(in_stack_fffffffffffffe24,
                                                      in_stack_fffffffffffffe20));
        bVar14 = WVar12 == 0;
      }
      if ((bVar14) && (local_bc != 0)) {
        WVar12 = ihevcd_compare_pu_t(in_stack_fffffffffffffe28,
                                     (pu_t *)CONCAT44(in_stack_fffffffffffffe24,
                                                      in_stack_fffffffffffffe20));
        bVar14 = WVar12 == 0;
      }
    }
    if (bVar14) {
      (&local_88)[(long)(int)local_100 * 2] = *puVar13;
      (&uStack_80)[(long)(int)local_100 * 2] = puVar13[1];
      uVar15 = local_100 + 1;
      if (local_100 + 1 == uVar11) {
        *local_28 = (&local_88)[(long)(int)local_100 * 2];
        *(undefined4 *)(local_28 + 1) = *(undefined4 *)(&uStack_80 + (long)(int)local_100 * 2);
        *(uint *)((long)local_28 + 0xc) =
             *(uint *)((long)local_28 + 0xc) & 0xfff9ffff |
             (*(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) >> 0x11 & 3) << 0x11;
        return;
      }
    }
  }
  local_100 = uVar15;
  memset(&stack0xfffffffffffffed8,0,8);
  ihevcd_collocated_mvp
            ((mv_ctxt_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (pu_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (mv_t *)CONCAT44(in_stack_00000020 + in_stack_00000010,zero_idx + in_stack_00000018),
             (WORD32 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,y_col_00);
  if ((in_stack_fffffffffffffed8 != 0) || (in_stack_fffffffffffffedc != 0)) {
    *(undefined4 *)(&local_88 + (long)(int)local_100 * 2) = in_stack_fffffffffffffee0;
    *(undefined4 *)((long)&local_88 + (long)(int)local_100 * 0x10 + 4) = in_stack_fffffffffffffee4;
  }
  if ((in_stack_fffffffffffffed8 == 0) || (in_stack_fffffffffffffedc == 0)) {
    uVar15 = in_stack_fffffffffffffed8;
    uVar16 = in_stack_fffffffffffffedc;
    ihevcd_collocated_mvp
              ((mv_ctxt_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (pu_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (mv_t *)CONCAT44(in_stack_00000020 + (in_stack_00000010 >> 1),
                                zero_idx + (in_stack_00000018 >> 1)),
               (WORD32 *)CONCAT44(in_stack_fffffffffffffed8,in_stack_fffffffffffffedc),
               in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,y_col_00);
    if (in_stack_fffffffffffffed8 == 0) {
      *(undefined4 *)(&local_88 + (long)(int)local_100 * 2) = in_stack_fffffffffffffee0;
    }
    if (in_stack_fffffffffffffedc == 0) {
      *(undefined4 *)((long)&local_88 + (long)(int)local_100 * 0x10 + 4) = in_stack_fffffffffffffee4
      ;
    }
    in_stack_fffffffffffffed8 = uVar15 | in_stack_fffffffffffffed8;
    in_stack_fffffffffffffedc = uVar16 | in_stack_fffffffffffffedc;
  }
  *(undefined1 *)(&uStack_80 + (long)(int)local_100 * 2) = 0;
  *(undefined1 *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 1) = 0;
  if (in_stack_fffffffffffffed8 == 0) {
    local_1ec = 1;
  }
  else {
    local_1ec = 0;
    if (in_stack_fffffffffffffedc != 0) {
      local_1ec = 2;
    }
  }
  *(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) =
       *(uint *)((long)&uStack_80 + (long)(int)local_100 * 0x10 + 4) & 0xfff9ffff |
       local_1ec << 0x11;
  local_1ed = in_stack_fffffffffffffed8 != 0 || in_stack_fffffffffffffedc != 0;
  local_100 = local_1ed + local_100;
  if (local_100 == uVar11) {
    *local_28 = (&local_88)[(long)(int)(local_100 - 1) * 2];
    *(undefined4 *)(local_28 + 1) = *(undefined4 *)(&uStack_80 + (long)(int)(local_100 - 1) * 2);
    *(uint *)((long)local_28 + 0xc) =
         *(uint *)((long)local_28 + 0xc) & 0xfff9ffff |
         (*(uint *)((long)&uStack_80 + (long)(int)(local_100 - 1) * 0x10 + 4) >> 0x11 & 3) << 0x11;
  }
  else {
    iVar8 = (int)*(char *)(local_38 + 0x50);
    if (((iVar8 == 0) && (1 < local_100)) && (local_100 < 5)) {
      memcpy(local_178,&DAT_002dfe90,0x30);
      memcpy(local_1a8,&DAT_002dfec0,0x30);
      local_1b4 = 0;
      iVar9 = local_100 * (local_100 - 1);
      while (local_1b4 < iVar9) {
        iVar10 = local_178[local_1b4];
        iVar4 = local_1a8[local_1b4];
        if (((*(uint *)((long)&uStack_80 + (long)iVar10 * 0x10 + 4) >> 0x11 & 3) != 1) &&
           ((*(uint *)((long)&uStack_80 + (long)iVar4 * 0x10 + 4) >> 0x11 & 3) != 0)) {
          cVar2 = *(char *)(&uStack_80 + (long)iVar10 * 2);
          cVar3 = *(char *)((long)&uStack_80 + (long)iVar4 * 0x10 + 1);
          uVar5 = *(undefined4 *)(&local_88 + (long)iVar10 * 2);
          uVar6 = *(undefined4 *)((long)&local_88 + (long)iVar4 * 0x10 + 4);
          if (*(int *)(*(long *)(lVar7 + 0x378 + (long)cVar2 * 0x18) + 0x10) ==
              *(int *)(*(long *)(local_a0 + (long)cVar3 * 0x18) + 0x10)) {
            local_1be = (short)uVar5;
            local_1c2 = (short)uVar6;
            if (local_1be == local_1c2) {
              sStack_1bc = (short)((uint)uVar5 >> 0x10);
              sStack_1c0 = (short)((uint)uVar6 >> 0x10);
              if (sStack_1bc == sStack_1c0) goto LAB_0013a440;
            }
          }
          local_100 = local_100 + 1;
          if (local_100 == uVar11) {
            *(undefined4 *)local_28 = uVar5;
            *(undefined4 *)((long)local_28 + 4) = uVar6;
            *(char *)(local_28 + 1) = cVar2;
            *(char *)((long)local_28 + 9) = cVar3;
            *(uint *)((long)local_28 + 0xc) = *(uint *)((long)local_28 + 0xc) & 0xfff9ffff | 0x40000
            ;
            return;
          }
        }
LAB_0013a440:
        local_1b4 = local_1b4 + 1;
        if ((local_1b4 == iVar9) || (local_100 == 5)) break;
      }
    }
    iVar9 = (uVar11 - local_100) + -1;
    if (iVar8 == 1) {
      cVar2 = *(char *)(local_38 + 0xa4);
    }
    else if (*(char *)(local_38 + 0xa4) < *(char *)(local_38 + 0xa5)) {
      cVar2 = *(char *)(local_38 + 0xa4);
    }
    else {
      cVar2 = *(char *)(local_38 + 0xa5);
    }
    if (cVar2 <= iVar9) {
      iVar9 = 0;
    }
    *(char *)(local_28 + 1) = (char)iVar9;
    if (iVar8 == 1) {
      *(undefined1 *)((long)local_28 + 9) = 0;
      *(uint *)((long)local_28 + 0xc) = *(uint *)((long)local_28 + 0xc) & 0xfff9ffff;
    }
    else {
      *(char *)((long)local_28 + 9) = (char)iVar9;
      *(uint *)((long)local_28 + 0xc) = *(uint *)((long)local_28 + 0xc) & 0xfff9ffff | 0x40000;
    }
    *(undefined2 *)local_28 = 0;
    *(undefined2 *)((long)local_28 + 2) = 0;
    *(undefined2 *)((long)local_28 + 4) = 0;
    *(undefined2 *)((long)local_28 + 6) = 0;
  }
  return;
}

Assistant:

void ihevcd_mv_merge(mv_ctxt_t *ps_mv_ctxt,
                     UWORD32 *pu4_top_pu_idx,
                     UWORD32 *pu4_left_pu_idx,
                     WORD32 left_nbr_4x4_strd,
                     pu_t *ps_pu,
                     WORD32 part_mode,
                     WORD32 part_idx,
                     WORD32 part_wd,
                     WORD32 part_ht,
                     WORD32 part_pos_x,
                     WORD32 part_pos_y,
                     WORD32 single_mcl_flag,
                     WORD32 lb_avail,
                     WORD32 l_avail,
                     WORD32 tr_avail,
                     WORD32 t_avail,
                     WORD32 tl_avail)
{
    /******************************************************/
    /*      Spatial Merge Candidates                      */
    /******************************************************/
    slice_header_t *ps_slice_hdr;
    pu_t as_pu_merge_list[MAX_NUM_MERGE_CAND];
    pps_t *ps_pps;
    ref_list_t *ps_ref_list[2];
    WORD32 sum_avail_a0_a1_b0_b1 = 0; /*Sum of availability of A0, A1, B0, B1*/
    WORD32 nbr_x, nbr_y;
    WORD32 nbr_avail[MAX_NUM_MV_NBR];
    WORD32 merge_shift;
    WORD32 nbr_pu_idx;
    pu_t *ps_nbr_pu[MAX_NUM_MV_NBR];
    WORD32 max_num_merge_cand;
    WORD32 candidate_cnt;
    WORD32 pos_x_merge_shift, pos_y_merge_shift;

    ps_slice_hdr = ps_mv_ctxt->ps_slice_hdr;
    ps_pps = ps_mv_ctxt->ps_pps;
    /* Initializing reference list */
    ps_ref_list[0] = ps_slice_hdr->as_ref_pic_list0;
    ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list1;
    if(PSLICE == ps_slice_hdr->i1_slice_type)
        ps_ref_list[1] = ps_slice_hdr->as_ref_pic_list0;

    candidate_cnt = 0;
    /*******************************************/
    /* Neighbor location: Graphical indication */
    /*                                         */
    /*          B2 _____________B1 B0          */
    /*            |               |            */
    /*            |               |            */
    /*            |               |            */
    /*            |      PU     ht|            */
    /*            |               |            */
    /*            |               |            */
    /*          A1|______wd_______|            */
    /*          A0                             */
    /*                                         */
    /*******************************************/

    merge_shift = ps_pps->i1_log2_parallel_merge_level;

    /* Availability check */
    /* A1 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht - 1; /* A1 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A1] = l_avail
                    && (!ps_nbr_pu[NBR_A1]->b1_intra_flag); /* A1 */

    pos_x_merge_shift = (part_pos_x >> merge_shift);
    pos_y_merge_shift = (part_pos_y >> merge_shift);
    max_num_merge_cand = ps_pu->b3_merge_idx + 1;

    {
        if(nbr_avail[NBR_A1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A1] = 0;
            }

            /* SPEC JCTVC-K1003_v9 version has a different way using not available       */
            /* candidates compared to software. for non square part and seconf part case */
            /* ideally nothing from the 1st partition should be used as per spec but     */
            /* HM 8.2 dev verison does not adhere to this. currenlty code fllows HM      */

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_Nx2N) || (part_mode == PART_nLx2N) ||
                                            (part_mode == PART_nRx2N)))
            {
                nbr_avail[NBR_A1] = 0;
            }
            sum_avail_a0_a1_b0_b1 += nbr_avail[NBR_A1];
            if(nbr_avail[NBR_A1])
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /* B1 */
    nbr_x = part_pos_x + part_wd - 1;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B1] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B1] = t_avail
                    && (!ps_nbr_pu[NBR_B1]->b1_intra_flag); /* B1 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B1];

        if(nbr_avail[NBR_B1])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            /* if single MCL is 0 , second part of 2 part in CU */
            else if((single_mcl_flag == 0) && (part_idx == 1) &&
                            ((part_mode == PART_2NxN) || (part_mode == PART_2NxnU) ||
                                            (part_mode == PART_2NxnD)))
            {
                nbr_avail[NBR_B1] = 0;
                avail_flag = 0;
            }

            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B1]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B1];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B0 */
    nbr_x = part_pos_x + part_wd;
    nbr_y = part_pos_y - 1;

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B0] = tr_avail
                    && (!ps_nbr_pu[NBR_B0]->b1_intra_flag); /* B0 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B0];

        /* if at same merge level */
        if(nbr_avail[NBR_B0])
        {
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
               (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_B1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* A0 */
    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y + part_ht; /* A0 */

    nbr_pu_idx = *(pu4_left_pu_idx + ((nbr_y - part_pos_y) >> 2) * left_nbr_4x4_strd);
    ps_nbr_pu[NBR_A0] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_A0] = lb_avail
                    && (!ps_nbr_pu[NBR_A0]->b1_intra_flag); /* A0 */
    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_A0];

        if(nbr_avail[NBR_A0])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_A0] = 0;
                avail_flag = 0;
            }
            else if(nbr_avail[NBR_A1])
            {
                avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_A0]);
            }

            sum_avail_a0_a1_b0_b1 += avail_flag;
            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_A0];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }
    /* B2 */

    nbr_x = part_pos_x - 1;
    nbr_y = part_pos_y - 1; /* B2 */

    nbr_pu_idx = *(pu4_top_pu_idx + ((nbr_x - part_pos_x) >> 2));
    ps_nbr_pu[NBR_B2] = ps_mv_ctxt->ps_pic_pu + nbr_pu_idx;

    nbr_avail[NBR_B2] = tl_avail
                    && (!ps_nbr_pu[NBR_B2]->b1_intra_flag); /* B2 */

    {
        WORD32 avail_flag;
        avail_flag = nbr_avail[NBR_B2];

        if(nbr_avail[NBR_B2])
        {
            /* if at same merge level */
            if(pos_x_merge_shift == (nbr_x >> merge_shift) &&
                            (pos_y_merge_shift == (nbr_y >> merge_shift)))
            {
                nbr_avail[NBR_B2] = 0;
                avail_flag = 0;
            }
            else if(4 == sum_avail_a0_a1_b0_b1)
            {
                avail_flag = 0;
            }

            else
            {
                if(nbr_avail[NBR_A1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_A1], ps_nbr_pu[NBR_B2]);
                }

                if(avail_flag && nbr_avail[NBR_B1])
                {
                    avail_flag = !ihevcd_compare_pu_t(ps_nbr_pu[NBR_B1], ps_nbr_pu[NBR_B2]);
                }
            }

            if(avail_flag)
            {
                as_pu_merge_list[candidate_cnt] = *ps_nbr_pu[NBR_B2];
                candidate_cnt++;
                if(candidate_cnt == max_num_merge_cand)
                {
                    ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
                    ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
                    return;
                }
            }
        }
    }

    /***********************************************************/
    /*          Collocated MV prediction                       */
    /***********************************************************/
    {
        mv_t as_mv_col[2];
        WORD32 avail_col_flag[2] = { 0 }, x_col, y_col;
        WORD32 avail_col_l0, avail_col_l1;
//        ihevcd_collocated_mvp(ps_mv_ctxt,ps_pu,part_pos_x,part_pos_y,part_wd,part_ht,as_mv_col,avail_col_flag,0);

        /* Checking Collocated MV availability at Bottom right of PU*/
        x_col = part_pos_x + part_wd;
        y_col = part_pos_y + part_ht;
        ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

        avail_col_l0 = avail_col_flag[0];
        avail_col_l1 = avail_col_flag[1];

        if(avail_col_l0 || avail_col_l1)
        {
            as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
        }

        if(avail_col_l0 == 0 || avail_col_l1 == 0)
        {
            /* Checking Collocated MV availability at Center of PU */
            x_col = part_pos_x + (part_wd >> 1);
            y_col = part_pos_y + (part_ht >> 1);
            ihevcd_collocated_mvp(ps_mv_ctxt, ps_pu, as_mv_col, avail_col_flag, 0, x_col, y_col);

            if(avail_col_l0 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l0_mv = as_mv_col[0];
            }
            if(avail_col_l1 == 0)
            {
                as_pu_merge_list[candidate_cnt].mv.s_l1_mv = as_mv_col[1];
            }

            avail_col_l0 |= avail_col_flag[0];
            avail_col_l1 |= avail_col_flag[1];
        }

        as_pu_merge_list[candidate_cnt].mv.i1_l0_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].mv.i1_l1_ref_idx = 0;
        as_pu_merge_list[candidate_cnt].b2_pred_mode = avail_col_l0 ? (avail_col_l1 ? PRED_BI : PRED_L0) : PRED_L1;

        candidate_cnt += (avail_col_l0 || avail_col_l1);

        if(candidate_cnt == max_num_merge_cand)
        {
            ps_pu[0].mv = as_pu_merge_list[candidate_cnt - 1].mv;
            ps_pu[0].b2_pred_mode = as_pu_merge_list[candidate_cnt - 1].b2_pred_mode;
            return;
        }

    }
    {
        WORD32 slice_type;

        slice_type = ps_slice_hdr->i1_slice_type;
        /* Colocated mv has to be added to list, if available */

        /******************************************************/
        /*      Bi pred merge candidates                      */
        /******************************************************/
        if(slice_type == BSLICE)
        {
            if((candidate_cnt > 1) && (candidate_cnt < MAX_NUM_MERGE_CAND))
            {
                WORD32 priority_list0[12] =
                    { 0, 1, 0, 2, 1, 2, 0, 3, 1, 3, 2, 3 };
                WORD32 priority_list1[12] =
                    { 1, 0, 2, 0, 2, 1, 3, 0, 3, 1, 3, 2 };
                WORD32 l0_cand, l1_cand;
                WORD32 bi_pred_idx = 0;
                WORD32 total_bi_pred_cand =
                                candidate_cnt * (candidate_cnt - 1);

                while(bi_pred_idx < total_bi_pred_cand)
                {
                    l0_cand = priority_list0[bi_pred_idx];
                    l1_cand = priority_list1[bi_pred_idx];

                    if((as_pu_merge_list[l0_cand].b2_pred_mode != PRED_L1)
                                    && (as_pu_merge_list[l1_cand].b2_pred_mode
                                                    != PRED_L0))
                    {
                        WORD8 i1_l0_ref_idx, i1_l1_ref_idx;
                        mv_t s_l0_mv, s_l1_mv;
                        pic_buf_t *ps_pic_buf_l0, *ps_pic_buf_l1;

                        i1_l0_ref_idx = as_pu_merge_list[l0_cand].mv.i1_l0_ref_idx;
                        i1_l1_ref_idx = as_pu_merge_list[l1_cand].mv.i1_l1_ref_idx;
                        ps_pic_buf_l0 = (pic_buf_t *)((ps_ref_list[0][i1_l0_ref_idx].pv_pic_buf));
                        ps_pic_buf_l1 = (pic_buf_t *)((ps_ref_list[1][i1_l1_ref_idx].pv_pic_buf));
                        s_l0_mv = as_pu_merge_list[l0_cand].mv.s_l0_mv;
                        s_l1_mv = as_pu_merge_list[l1_cand].mv.s_l1_mv;

                        if((ps_pic_buf_l0->i4_abs_poc != ps_pic_buf_l1->i4_abs_poc)
                                        || (s_l0_mv.i2_mvx != s_l1_mv.i2_mvx)
                                        || (s_l0_mv.i2_mvy != s_l1_mv.i2_mvy))
                        {
                            candidate_cnt++;
                            if(candidate_cnt == max_num_merge_cand)
                            {
                                ps_pu[0].mv.s_l0_mv = s_l0_mv;
                                ps_pu[0].mv.s_l1_mv = s_l1_mv;
                                ps_pu[0].mv.i1_l0_ref_idx = i1_l0_ref_idx;
                                ps_pu[0].mv.i1_l1_ref_idx = i1_l1_ref_idx;
                                ps_pu[0].b2_pred_mode = PRED_BI;
                                return;
                            }
                        }
                    }

                    bi_pred_idx++;

                    if((bi_pred_idx == total_bi_pred_cand)
                                    || (candidate_cnt == MAX_NUM_MERGE_CAND))
                    {
                        break;
                    }
                }
            }
        }

        /******************************************************/
        /*      Zero merge candidates                         */
        /******************************************************/
//        if(candidate_cnt < max_num_merge_cand)
        {
            WORD32 num_ref_idx;
            WORD32 zero_idx;

            zero_idx = max_num_merge_cand - candidate_cnt - 1;

            if(slice_type == PSLICE)
                num_ref_idx = ps_slice_hdr->i1_num_ref_idx_l0_active;
            else
                /* Slice type B */
                num_ref_idx = MIN(ps_slice_hdr->i1_num_ref_idx_l0_active, ps_slice_hdr->i1_num_ref_idx_l1_active);

            if(zero_idx >= num_ref_idx)
                zero_idx = 0;

            ps_pu[0].mv.i1_l0_ref_idx = zero_idx;
            if(slice_type == PSLICE)
            {
                ps_pu[0].mv.i1_l1_ref_idx = 0;
                ps_pu[0].b2_pred_mode = PRED_L0;
            }
            else /* Slice type B */
            {
                ps_pu[0].mv.i1_l1_ref_idx = zero_idx;
                ps_pu[0].b2_pred_mode = PRED_BI;
            }

            ps_pu[0].mv.s_l0_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l0_mv.i2_mvy = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvx = 0;
            ps_pu[0].mv.s_l1_mv.i2_mvy = 0;

            candidate_cnt++;
        }
    }

    return;
}